

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O2

vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *
IndexTools::JointToIndividualIndices
          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *__return_storage_ptr__,
          LIndex jointI,vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *nrElems)

{
  pointer puVar1;
  LIndex *pLVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  allocator_type local_29;
  
  uVar5 = (long)(nrElems->
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(nrElems->
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
  uVar4 = (long)uVar5 >> 3;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (__return_storage_ptr__,uVar4 & 0xffffffff,&local_29);
  if ((int)(uVar5 >> 3) != 0) {
    pLVar2 = CalculateStepSize(nrElems);
    puVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar5 = 0; (uVar4 & 0xffffffff) != uVar5; uVar5 = uVar5 + 1) {
      uVar3 = jointI / pLVar2[uVar5];
      jointI = jointI % pLVar2[uVar5];
      puVar1[uVar5] = uVar3;
    }
    operator_delete__(pLVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<LIndex> IndexTools::JointToIndividualIndices(LIndex jointI,
       const vector<LIndex>& nrElems) 
{
    LIndex* step_size=0;
    Index vec_size = nrElems.size();
    vector<LIndex> result(vec_size);    
    if(vec_size > 0)
    {
        step_size=CalculateStepSize(nrElems);
        LIndex remainder = jointI;
        for(Index i=0; i < vec_size ; i++)
        {
            LIndex aI = remainder / step_size[i];
            result[i]= aI;//store this indiv. index
            remainder = remainder %  step_size[i];
        }
        delete [] step_size;
    }
    return(result);
}